

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgGridSequence.cpp
# Opt level: O0

void __thiscall
TasGrid::GridSequence::applyTransformationTransposed<1>(GridSequence *this,double *weights)

{
  allocator<int> *paVar1;
  value_type vVar2;
  bool bVar3;
  int iVar4;
  iterator __first;
  iterator __last;
  reference piVar5;
  size_type __n;
  reference pvVar6;
  int *piVar7;
  iterator iVar8;
  reference rVar9;
  _Bit_iterator __first_00;
  _Bit_iterator __last_00;
  bool local_201;
  MultiIndexSet *local_1a8;
  reference local_198;
  int local_184;
  double dStack_180;
  int d;
  double weight_mult;
  _Bit_type local_170;
  int local_168;
  bool local_161;
  int branch;
  uint local_158;
  _Bit_type *local_150;
  uint local_148;
  _Bit_type *local_140;
  uint local_138;
  _Bit_type *local_130;
  uint local_128;
  int local_11c;
  int *piStack_118;
  int current;
  int *p;
  int local_108;
  int i;
  int l;
  vector<bool,_std::allocator<bool>_> used;
  undefined1 local_d0 [8];
  vector<int,_std::allocator<int>_> monkey_tail;
  undefined1 local_b0 [8];
  vector<int,_std::allocator<int>_> monkey_count;
  Data2D<int> parents;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_50;
  int local_44;
  undefined1 local_40 [4];
  int top_level;
  vector<int,_std::allocator<int>_> level;
  int num_points;
  MultiIndexSet *work;
  double *weights_local;
  GridSequence *this_local;
  
  bVar3 = MultiIndexSet::empty(&(this->super_BaseCanonicalGrid).points);
  if (bVar3) {
    local_1a8 = &(this->super_BaseCanonicalGrid).needed;
  }
  else {
    local_1a8 = &(this->super_BaseCanonicalGrid).points;
  }
  level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = MultiIndexSet::getNumIndexes(local_1a8);
  MultiIndexManipulations::computeLevels((vector<int,_std::allocator<int>_> *)local_40,local_1a8);
  __first = ::std::vector<int,_std::allocator<int>_>::begin
                      ((vector<int,_std::allocator<int>_> *)local_40);
  __last = ::std::vector<int,_std::allocator<int>_>::end
                     ((vector<int,_std::allocator<int>_> *)local_40);
  local_50 = ::std::
             max_element<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                       (__first._M_current,__last._M_current);
  piVar5 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator*
                     (&local_50);
  local_44 = *piVar5;
  MultiIndexManipulations::computeDAGup
            ((Data2D<int> *)
             &monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,local_1a8);
  iVar4 = local_44 + 1;
  paVar1 = (allocator<int> *)
           ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage + 7);
  ::std::allocator<int>::allocator(paVar1);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_b0,(long)iVar4,paVar1);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&monkey_tail.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage + 7));
  iVar4 = local_44 + 1;
  paVar1 = (allocator<int> *)
           ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
                   _M_end_of_storage + 7);
  ::std::allocator<int>::allocator(paVar1);
  ::std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)local_d0,(long)iVar4,paVar1);
  ::std::allocator<int>::~allocator
            ((allocator<int> *)
             ((long)&used.super__Bvector_base<std::allocator<bool>_>._M_impl.
                     super__Bvector_impl_data._M_end_of_storage + 7));
  __n = (size_type)
        level.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_;
  ::std::allocator<bool>::allocator((allocator<bool> *)((long)&i + 3));
  ::std::vector<bool,_std::allocator<bool>_>::vector
            ((vector<bool,_std::allocator<bool>_> *)&l,__n,(allocator<bool> *)((long)&i + 3));
  ::std::allocator<bool>::~allocator((allocator<bool> *)((long)&i + 3));
  for (local_108 = local_44; 0 < local_108; local_108 = local_108 + -1) {
    for (p._4_4_ = 0;
        p._4_4_ < level.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage._4_4_; p._4_4_ = p._4_4_ + 1) {
      pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_40,(long)p._4_4_);
      if (*pvVar6 == local_108) {
        piStack_118 = MultiIndexSet::getIndex(local_1a8,p._4_4_);
        local_11c = 0;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_b0,0);
        vVar2 = p._4_4_;
        *pvVar6 = 0;
        pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)local_d0,0);
        *pvVar6 = vVar2;
        iVar8 = ::std::vector<bool,_std::allocator<bool>_>::begin
                          ((vector<bool,_std::allocator<bool>_> *)&l);
        local_140 = iVar8.super__Bit_iterator_base._M_p;
        local_138 = iVar8.super__Bit_iterator_base._M_offset;
        local_130 = local_140;
        local_128 = local_138;
        iVar8 = ::std::vector<bool,_std::allocator<bool>_>::end
                          ((vector<bool,_std::allocator<bool>_> *)&l);
        _branch = iVar8.super__Bit_iterator_base._M_p;
        local_158 = iVar8.super__Bit_iterator_base._M_offset;
        local_161 = false;
        __first_00.super__Bit_iterator_base._M_offset = local_128;
        __first_00.super__Bit_iterator_base._M_p = local_130;
        __first_00.super__Bit_iterator_base._12_4_ = 0;
        __last_00.super__Bit_iterator_base._12_4_ = 0;
        __last_00.super__Bit_iterator_base._M_p =
             (_Bit_type *)SUB128(iVar8.super__Bit_iterator_base._0_12_,0);
        __last_00.super__Bit_iterator_base._M_offset =
             SUB124(iVar8.super__Bit_iterator_base._0_12_,8);
        local_150 = _branch;
        local_148 = local_158;
        ::std::fill<std::_Bit_iterator,bool>(__first_00,__last_00,&local_161);
        while( true ) {
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_b0,0);
          if ((this->super_BaseCanonicalGrid).num_dimensions <= *pvVar6) break;
          pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)local_b0,(long)local_11c);
          if (*pvVar6 < (this->super_BaseCanonicalGrid).num_dimensions) {
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_d0,(long)local_11c);
            piVar7 = Data2D<int>::getStrip
                               ((Data2D<int> *)
                                &monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage,*pvVar6);
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_b0,(long)local_11c);
            local_168 = piVar7[*pvVar6];
            local_201 = true;
            if (local_168 != -1) {
              rVar9 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&l,(long)local_168);
              local_170 = rVar9._M_mask;
              weight_mult = (double)rVar9._M_p;
              local_201 = ::std::_Bit_reference::operator_cast_to_bool
                                    ((_Bit_reference *)&weight_mult);
            }
            if (local_201 == false) {
              piVar7 = MultiIndexSet::getIndex(local_1a8,local_168);
              dStack_180 = evalBasis(this,piVar7,piStack_118);
              for (local_184 = 0; local_184 < (this->super_BaseCanonicalGrid).num_dimensions;
                  local_184 = local_184 + 1) {
                iVar4 = local_168 * (this->super_BaseCanonicalGrid).num_dimensions + local_184;
                weights[iVar4] =
                     -weights[p._4_4_ * (this->super_BaseCanonicalGrid).num_dimensions + local_184]
                     * dStack_180 + weights[iVar4];
              }
              rVar9 = ::std::vector<bool,_std::allocator<bool>_>::operator[]
                                ((vector<bool,_std::allocator<bool>_> *)&l,(long)local_168);
              local_198 = rVar9;
              ::std::_Bit_reference::operator=(&local_198,true);
              local_11c = local_11c + 1;
              pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_b0,(long)local_11c);
              iVar4 = local_168;
              *pvVar6 = 0;
              pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_d0,(long)local_11c);
              *pvVar6 = iVar4;
            }
            else {
              pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                                 ((vector<int,_std::allocator<int>_> *)local_b0,(long)local_11c);
              *pvVar6 = *pvVar6 + 1;
            }
          }
          else {
            local_11c = local_11c + -1;
            pvVar6 = ::std::vector<int,_std::allocator<int>_>::operator[]
                               ((vector<int,_std::allocator<int>_> *)local_b0,(long)local_11c);
            *pvVar6 = *pvVar6 + 1;
          }
        }
      }
    }
  }
  ::std::vector<bool,_std::allocator<bool>_>::~vector((vector<bool,_std::allocator<bool>_> *)&l);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_d0);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_b0);
  Data2D<int>::~Data2D
            ((Data2D<int> *)
             &monkey_count.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  ::std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_40);
  return;
}

Assistant:

void GridSequence::applyTransformationTransposed(double weights[]) const{
    // mode 0: applies the transposed linear operator for interpolation and quadrature.
    // mode 1: applies the transposed linear operator for differentiation.
    const MultiIndexSet& work = (points.empty()) ? needed : points;
    int num_points = work.getNumIndexes();

    std::vector<int> level = MultiIndexManipulations::computeLevels(work);
    int top_level = *std::max_element(level.begin(), level.end());

    Data2D<int> parents = MultiIndexManipulations::computeDAGup(work);

    std::vector<int> monkey_count(top_level + 1);
    std::vector<int> monkey_tail(top_level + 1);
    std::vector<bool> used(num_points);

    for(int l=top_level; l>0; l--){
        for(int i=0; i<num_points; i++){
            if (level[i] == l){
                const int* p = work.getIndex(i);
                int current = 0;

                monkey_count[0] = 0;
                monkey_tail[0] = i;
                std::fill(used.begin(), used.end(), false);

                while(monkey_count[0] < num_dimensions){
                    if (monkey_count[current] < num_dimensions){
                        int branch = parents.getStrip(monkey_tail[current])[monkey_count[current]];
                        if ((branch == -1) || used[branch]){
                            monkey_count[current]++;
                        }else{
                            if (mode == 0) {
                                weights[branch] -= weights[i] * evalBasis(work.getIndex(branch), p);
                            } else {
                                double weight_mult = evalBasis(work.getIndex(branch), p);
                                for (int d=0; d<num_dimensions; d++)
                                    weights[branch * num_dimensions + d] -= weights[i * num_dimensions + d] * weight_mult;
                            }
                            used[branch] = true;

                            monkey_count[++current] = 0;
                            monkey_tail[current] = branch;
                        }
                    }else{
                        monkey_count[--current]++;
                    }
                }
            }
        }
    }
}